

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

bool re2::PCRE::Arg::parse_double(char *str,int n,void *dest)

{
  bool bVar1;
  int *piVar2;
  double dVar3;
  char *end;
  char buf [200];
  char *local_100;
  char local_f8 [208];
  
  if ((n != 0) && (n < 200)) {
    memcpy(local_f8,str,(long)n);
    local_f8[n] = '\0';
    piVar2 = __errno_location();
    *piVar2 = 0;
    dVar3 = strtod(local_f8,&local_100);
    if ((local_100 == local_f8 + n) && (*piVar2 == 0)) {
      bVar1 = true;
      if (dest != (void *)0x0) {
        *(double *)dest = dVar3;
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool PCRE::Arg::parse_double(const char* str, int n, void* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength];
  if (n >= kMaxLength) return false;
  memcpy(buf, str, n);
  buf[n] = '\0';
  errno = 0;
  char* end;
  double r = strtod(buf, &end);
  if (end != buf + n) {
#ifdef _WIN32
    // Microsoft's strtod() doesn't handle inf and nan, so we have to
    // handle it explicitly.  Speed is not important here because this
    // code is only called in unit tests.
    bool pos = true;
    const char* i = buf;
    if ('-' == *i) {
      pos = false;
      ++i;
    } else if ('+' == *i) {
      ++i;
    }
    if (0 == stricmp(i, "inf") || 0 == stricmp(i, "infinity")) {
      r = std::numeric_limits<double>::infinity();
      if (!pos)
        r = -r;
    } else if (0 == stricmp(i, "nan")) {
      r = std::numeric_limits<double>::quiet_NaN();
    } else {
      return false;
    }
#else
    return false;   // Leftover junk
#endif
  }
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<double*>(dest)) = r;
  return true;
}